

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptArray::JoinHelper
          (Var thisArg,JavascriptString *separator,ScriptContext *scriptContext)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  BOOL BVar4;
  ThreadContext *threadContext;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  bool local_131;
  bool local_119;
  JavascriptProxy *local_110;
  anon_class_32_4_6c10a318 local_e8;
  anon_class_56_7_f9d0ff62 local_c8;
  JavascriptString *local_90;
  JavascriptString *res;
  RecyclableObject *pRStack_80;
  bool isTargetObjectPushed;
  Var target;
  bool isProxy;
  JavascriptProxy *pJStack_70;
  bool isArray;
  JavascriptProxy *proxy;
  JavascriptArray *arr;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  JavascriptString *separator_local;
  Var thisArg_local;
  JavascriptString *local_10;
  
  jsReentLock._24_8_ = scriptContext;
  scriptContext_local = (ScriptContext *)separator;
  separator_local = (JavascriptString *)thisArg;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,separator_local);
  proxy = (JavascriptProxy *)TryVarToNonES5Array(separator_local);
  local_10 = separator_local;
  bVar3 = VarIs<Js::JavascriptProxy>(separator_local);
  if (bVar3) {
    local_110 = UnsafeVarTo<Js::JavascriptProxy>(local_10);
  }
  else {
    local_110 = (JavascriptProxy *)0x0;
  }
  uVar2 = jsReentLock._24_8_;
  pJStack_70 = local_110;
  local_119 = false;
  if (proxy != (JavascriptProxy *)0x0) {
    pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)proxy);
    local_119 = (ScriptContext *)uVar2 == pSVar5;
  }
  uVar2 = jsReentLock._24_8_;
  target._7_1_ = local_119;
  local_131 = false;
  if (pJStack_70 != (JavascriptProxy *)0x0) {
    pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)pJStack_70);
    local_131 = (ScriptContext *)uVar2 == pSVar5;
  }
  target._6_1_ = local_131;
  pRStack_80 = (RecyclableObject *)0x0;
  res._7_1_ = 0;
  if (local_131 == false) {
    BVar4 = ScriptContext::CheckObject((ScriptContext *)jsReentLock._24_8_,separator_local);
    if (BVar4 != 0) {
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      thisArg_local = JavascriptLibrary::GetEmptyString(pJVar7);
      goto LAB_010ce49c;
    }
  }
  else {
    if (pJStack_70 == (JavascriptProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x11c1,"(proxy)","proxy");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pRStack_80 = Js::JavascriptProxy::GetTarget(pJStack_70);
    if (pRStack_80 != (RecyclableObject *)0x0) {
      BVar4 = ScriptContext::CheckObject((ScriptContext *)jsReentLock._24_8_,pRStack_80);
      if (BVar4 != 0) {
        pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        thisArg_local = JavascriptLibrary::GetEmptyString(pJVar7);
        goto LAB_010ce49c;
      }
      ScriptContext::PushObject((ScriptContext *)jsReentLock._24_8_,pRStack_80);
      res._7_1_ = 1;
    }
  }
  if ((res._7_1_ & 1) == 0) {
    ScriptContext::PushObject((ScriptContext *)jsReentLock._24_8_,separator_local);
  }
  local_90 = (JavascriptString *)0x0;
  local_c8.isArray = (bool *)((long)&target + 7);
  local_e8.thisArg = &separator_local;
  local_c8.arr = (JavascriptArray **)&proxy;
  local_c8.jsReentLock = (JsReentLock *)local_50;
  local_c8.res = &local_90;
  local_c8.separator = (JavascriptString **)&scriptContext_local;
  local_e8.scriptContext = (ScriptContext **)&jsReentLock.m_savedNoJsReentrancy;
  local_e8.isProxy = (bool *)((long)&target + 6);
  local_e8.target = &stack0xffffffffffffff80;
  local_c8.thisArg = local_e8.thisArg;
  local_c8.scriptContext = local_e8.scriptContext;
  TryFinally<Js::JavascriptArray::JoinHelper(void*,Js::JavascriptString*,Js::ScriptContext*)::__0,Js::JavascriptArray::JoinHelper(void*,Js::JavascriptString*,Js::ScriptContext*)::__1>
            (&local_c8,&local_e8);
  if (local_90 == (JavascriptString *)0x0) {
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    local_90 = JavascriptLibrary::GetEmptyString(pJVar7);
  }
  thisArg_local = local_90;
LAB_010ce49c:
  res._0_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return (JavascriptString *)thisArg_local;
}

Assistant:

JavascriptString* JavascriptArray::JoinHelper(Var thisArg, JavascriptString* separator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, thisArg);

        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(thisArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(thisArg);
        bool isArray = arr && (scriptContext == arr->GetScriptContext());
        bool isProxy = proxy && (scriptContext == proxy->GetScriptContext());
        Var target = NULL;
        bool isTargetObjectPushed = false;
        // if we are visiting a proxy object, track that we have visited the target object as well so the next time w
        // call the join helper for the target of this proxy, we will return above.
        if (isProxy)
        {
            Assert(proxy);
            target = proxy->GetTarget();
            if (target != nullptr)
            {
                // If we end up joining same array, instead of going in infinite loop, return the empty string
                if (scriptContext->CheckObject(target))
                {
                    return scriptContext->GetLibrary()->GetEmptyString();
                }
                else
                {
                    scriptContext->PushObject(target);
                    isTargetObjectPushed = true;
                }
            }
        }
        // If we end up joining same array, instead of going in infinite loop, return the empty string
        else if (scriptContext->CheckObject(thisArg))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        if (!isTargetObjectPushed)
        {
            scriptContext->PushObject(thisArg);
        }

        JavascriptString* res = nullptr;

        TryFinally([&]()
        {
            if (isArray)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(thisArg);
#endif
                switch (arr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(arr, separator, scriptContext));
                    break;
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeIntArray>(arr), separator, scriptContext));
                    break;
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeFloatArray>(arr), separator, scriptContext));
                    break;
                }

            }
            else if (VarIs<RecyclableObject>(thisArg))
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(VarTo<RecyclableObject>(thisArg), separator, scriptContext));
            }
            else
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(scriptContext->GetLibrary()->CreateNumberObject(thisArg), separator, scriptContext));
            }
        },
        [&](bool/*hasException*/)
        {
            Var top = scriptContext->PopObject();
            if (isProxy)
            {
                AssertMsg(top == target, "Unmatched operation stack");
            }
            else
            {
                AssertMsg(top == thisArg, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }